

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O0

void __thiscall
helics::HandleManager::addAlias(HandleManager *this,string_view interfaceName,string_view alias)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view alias_00;
  string_view alias_01;
  string_view alias_02;
  string_view alias_03;
  string_view alias_04;
  string_view alias_05;
  string_view alias_06;
  string_view alias_07;
  string_view alias_08;
  string_view alias_09;
  string_view alias_10;
  string_view alias_11;
  string_view alias_12;
  string_view alias_13;
  string_view alias_14;
  string_view alias_15;
  string_view interfaceName_00;
  string_view interfaceName_01;
  string_view interfaceName_02;
  string_view interfaceName_03;
  string_view interfaceName_04;
  string_view interfaceName_05;
  string_view interfaceName_06;
  string_view interfaceName_07;
  string_view interfaceName_08;
  string_view interfaceName_09;
  string_view interfaceName_10;
  string_view interfaceName_11;
  string_view interfaceName_12;
  string_view interfaceName_13;
  string_view interfaceName_14;
  string_view interfaceName_15;
  string_view alias_16;
  string_view alias_17;
  string_view interfaceName_16;
  string_view interfaceName_17;
  bool bVar1;
  key_type *__k;
  reference pbVar2;
  undefined8 in_RCX;
  size_t in_RDI;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined8 in_R8;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar3;
  __sv_type _Var4;
  basic_string_view<char,_std::char_traits<char>_> *interfaceAlias_1;
  iterator __end2_1;
  iterator __begin2_1;
  mapped_type *__range2_1;
  mapped_type *aliasRange_1;
  basic_string_view<char,_std::char_traits<char>_> *interfaceAlias;
  iterator __end2;
  iterator __begin2;
  mapped_type *__range2;
  mapped_type *aliasRange;
  bool cascade;
  string *interfaceStableName;
  string *aliasStableName;
  type_conflict3 *existing2;
  type *iName;
  type_conflict3 *existing1;
  type *aliasName;
  key_type *in_stack_fffffffffffffc48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc50;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffc58;
  basic_string_view<char,_std::char_traits<char>_> *__args;
  char *in_stack_fffffffffffffc70;
  size_t in_stack_fffffffffffffc78;
  char *in_stack_fffffffffffffc80;
  HandleManager *in_stack_fffffffffffffce0;
  HandleManager *this_01;
  size_t in_stack_fffffffffffffce8;
  char *pcVar5;
  char *in_stack_fffffffffffffcf0;
  char *in_stack_fffffffffffffcf8;
  char *in_stack_fffffffffffffd00;
  HandleManager *in_stack_fffffffffffffd68;
  size_t in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  size_t in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_260;
  mapped_type *local_258;
  __sv_type local_250;
  mapped_type *local_240;
  __sv_type local_238;
  __sv_type local_228;
  __sv_type local_218;
  __sv_type local_208;
  __sv_type local_1f8;
  __sv_type local_1e8;
  __sv_type local_1d8;
  __sv_type local_1c8;
  __sv_type local_1b8;
  __sv_type local_1a8;
  __sv_type local_198;
  size_t local_188;
  char *local_180;
  __sv_type local_178;
  size_t local_168;
  char *local_160;
  __sv_type local_158;
  size_t local_148;
  char *local_140;
  __sv_type local_138;
  size_t local_128;
  char *local_120;
  undefined8 local_118;
  undefined8 local_110;
  size_t local_108;
  char *local_100;
  reference local_f8;
  basic_string_view<char,_std::char_traits<char>_> *local_f0;
  __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  local_e8;
  mapped_type *local_e0;
  __sv_type local_d8;
  mapped_type *local_c8;
  __sv_type local_c0;
  __sv_type local_b0;
  undefined1 local_99;
  reference local_98;
  reference local_90;
  type_conflict3 *local_88;
  type *local_80;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_78;
  undefined1 local_70;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_68;
  undefined1 local_60;
  type_conflict3 *local_58;
  type *local_50;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  undefined1 local_40;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  undefined8 local_20;
  undefined8 local_18;
  
  this_00 = (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(in_RDI + 0x1a0);
  local_20 = in_RCX;
  local_18 = in_R8;
  pVar3 = std::
          unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::emplace<std::basic_string_view<char,std::char_traits<char>>&>
                    (this_00,in_stack_fffffffffffffc58);
  local_48._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  local_40 = pVar3.second;
  __args = &local_38;
  local_38._M_len = (size_t)local_48._M_cur;
  local_38._M_str._0_1_ = local_40;
  local_50 = std::get<0ul,std::__detail::_Node_iterator<std::__cxx11::string,true,true>,bool>
                       ((pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
                         *)0x64d624);
  local_58 = std::get<1ul,std::__detail::_Node_iterator<std::__cxx11::string,true,true>,bool>
                       ((pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
                         *)0x64d636);
  pVar3 = std::
          unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::emplace<std::basic_string_view<char,std::char_traits<char>>&>(this_00,__args);
  local_78._M_cur =
       (__node_type *)
       pVar3.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  local_70 = pVar3.second;
  local_68._M_cur = local_78._M_cur;
  local_60 = local_70;
  local_80 = std::get<0ul,std::__detail::_Node_iterator<std::__cxx11::string,true,true>,bool>
                       ((pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
                         *)0x64d68a);
  local_88 = std::get<1ul,std::__detail::_Node_iterator<std::__cxx11::string,true,true>,bool>
                       ((pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
                         *)0x64d69f);
  local_90 = CLI::std::__detail::
             _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
             ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                          *)0x64d6b4);
  local_98 = CLI::std::__detail::
             _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
             ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                          *)0x64d6c9);
  local_b0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_16._M_str = in_stack_fffffffffffffd88;
  interfaceName_16._M_len = in_stack_fffffffffffffd80;
  alias_16._M_str = in_stack_fffffffffffffd78;
  alias_16._M_len = in_stack_fffffffffffffd70;
  local_99 = addAliasName(in_stack_fffffffffffffd68,interfaceName_16,alias_16);
  if ((bool)local_99) {
    in_stack_fffffffffffffc50 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x168);
    local_d8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
    local_e0 = std::
               unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
               ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                             *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    local_c8 = local_e0;
    local_e8._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         CLI::std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)in_stack_fffffffffffffc48);
    local_f0 = (basic_string_view<char,_std::char_traits<char>_> *)
               CLI::std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)in_stack_fffffffffffffc48);
    while (bVar1 = __gnu_cxx::
                   operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_fffffffffffffc50,
                              (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_fffffffffffffc48), ((bVar1 ^ 0xffU) & 1) != 0) {
      local_f8 = __gnu_cxx::
                 __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                 ::operator*(&local_e8);
      local_108 = local_f8->_M_len;
      local_100 = local_f8->_M_str;
      local_118 = local_20;
      local_110 = local_18;
      __x._M_str = in_stack_fffffffffffffc80;
      __x._M_len = in_stack_fffffffffffffc78;
      __y._M_str = in_stack_fffffffffffffc70;
      __y._M_len = in_RDI;
      bVar1 = std::operator==(__x,__y);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_128 = local_f8->_M_len;
        local_120 = local_f8->_M_str;
        local_138 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffc50);
        interfaceName_00._M_str = in_stack_fffffffffffffd00;
        interfaceName_00._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_00._M_str = in_stack_fffffffffffffcf0;
        alias_00._M_len = in_stack_fffffffffffffce8;
        addPublicationAlias(in_stack_fffffffffffffce0,interfaceName_00,alias_00);
        local_148 = local_f8->_M_len;
        local_140 = local_f8->_M_str;
        local_158 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffc50);
        interfaceName_01._M_str = in_stack_fffffffffffffd00;
        interfaceName_01._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_01._M_str = in_stack_fffffffffffffcf0;
        alias_01._M_len = in_stack_fffffffffffffce8;
        addInputAlias(in_stack_fffffffffffffce0,interfaceName_01,alias_01);
        local_168 = local_f8->_M_len;
        local_160 = local_f8->_M_str;
        local_178 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffc50);
        interfaceName_02._M_str = in_stack_fffffffffffffd00;
        interfaceName_02._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_02._M_str = in_stack_fffffffffffffcf0;
        alias_02._M_len = in_stack_fffffffffffffce8;
        addEndpointAlias(in_stack_fffffffffffffce0,interfaceName_02,alias_02);
        local_188 = local_f8->_M_len;
        local_180 = local_f8->_M_str;
        local_198 = std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffc50);
        interfaceName_03._M_str = in_stack_fffffffffffffd00;
        interfaceName_03._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_03._M_str = in_stack_fffffffffffffcf0;
        alias_03._M_len = in_stack_fffffffffffffce8;
        addFilterAlias(in_stack_fffffffffffffce0,interfaceName_03,alias_03);
      }
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&local_e8);
    }
  }
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64da2c);
  local_1a8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64da51);
  local_1b8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_04._M_str = in_stack_fffffffffffffd00;
  interfaceName_04._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_04._M_str = in_stack_fffffffffffffcf0;
  alias_04._M_len = in_stack_fffffffffffffce8;
  addPublicationAlias(in_stack_fffffffffffffce0,interfaceName_04,alias_04);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64daa0);
  local_1c8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64dac5);
  local_1d8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_05._M_str = in_stack_fffffffffffffd00;
  interfaceName_05._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_05._M_str = in_stack_fffffffffffffcf0;
  alias_05._M_len = in_stack_fffffffffffffce8;
  addInputAlias(in_stack_fffffffffffffce0,interfaceName_05,alias_05);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64db14);
  local_1e8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64db39);
  local_1f8 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_06._M_str = in_stack_fffffffffffffd00;
  interfaceName_06._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_06._M_str = in_stack_fffffffffffffcf0;
  alias_06._M_len = in_stack_fffffffffffffce8;
  addEndpointAlias(in_stack_fffffffffffffce0,interfaceName_06,alias_06);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64db88);
  local_208 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64dbad);
  local_218 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_07._M_str = in_stack_fffffffffffffd00;
  interfaceName_07._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_07._M_str = in_stack_fffffffffffffcf0;
  alias_07._M_len = in_stack_fffffffffffffce8;
  addFilterAlias(in_stack_fffffffffffffce0,interfaceName_07,alias_07);
  local_228 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  local_238 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_17._M_str = in_stack_fffffffffffffd88;
  interfaceName_17._M_len = in_stack_fffffffffffffd80;
  alias_17._M_str = in_stack_fffffffffffffd78;
  alias_17._M_len = in_stack_fffffffffffffd70;
  local_99 = addAliasName(in_stack_fffffffffffffd68,interfaceName_17,alias_17);
  if ((bool)local_99) {
    __k = (key_type *)(in_RDI + 0x168);
    local_250 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
    local_258 = std::
                unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                ::operator[]((unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>_>_>
                              *)in_stack_fffffffffffffc50,__k);
    local_240 = local_258;
    local_260._M_current =
         (basic_string_view<char,_std::char_traits<char>_> *)
         CLI::std::
         vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)__k);
    CLI::std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *)__k);
    while (bVar1 = __gnu_cxx::
                   operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                             ((__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)in_stack_fffffffffffffc50,
                              (__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                               *)__k), ((bVar1 ^ 0xffU) & 1) != 0) {
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator*(&local_260);
      __x_00._M_str = in_stack_fffffffffffffc80;
      __x_00._M_len = in_stack_fffffffffffffc78;
      __y_00._M_str = in_stack_fffffffffffffc70;
      __y_00._M_len = in_RDI;
      bVar1 = std::operator==(__x_00,__y_00);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
        interfaceName_08._M_str = in_stack_fffffffffffffd00;
        interfaceName_08._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_08._M_str = in_stack_fffffffffffffcf0;
        alias_08._M_len = in_stack_fffffffffffffce8;
        addPublicationAlias(in_stack_fffffffffffffce0,interfaceName_08,alias_08);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
        interfaceName_09._M_str = in_stack_fffffffffffffd00;
        interfaceName_09._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_09._M_str = in_stack_fffffffffffffcf0;
        alias_09._M_len = in_stack_fffffffffffffce8;
        addInputAlias(in_stack_fffffffffffffce0,interfaceName_09,alias_09);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
        interfaceName_10._M_str = in_stack_fffffffffffffd00;
        interfaceName_10._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_10._M_str = in_stack_fffffffffffffcf0;
        alias_10._M_len = in_stack_fffffffffffffce8;
        addEndpointAlias(in_stack_fffffffffffffce0,interfaceName_10,alias_10);
        in_stack_fffffffffffffd00 = (char *)pbVar2->_M_len;
        _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
        in_stack_fffffffffffffcf0 = (char *)_Var4._M_len;
        in_stack_fffffffffffffcf8 = _Var4._M_str;
        interfaceName_11._M_str = in_stack_fffffffffffffd00;
        interfaceName_11._M_len = (size_t)in_stack_fffffffffffffcf8;
        alias_11._M_str = in_stack_fffffffffffffcf0;
        alias_11._M_len = in_stack_fffffffffffffce8;
        addFilterAlias(in_stack_fffffffffffffce0,interfaceName_11,alias_11);
      }
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&local_260);
    }
  }
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64df48);
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  this_01 = (HandleManager *)_Var4._M_len;
  pcVar5 = _Var4._M_str;
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64df6d);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_12._M_str = in_stack_fffffffffffffd00;
  interfaceName_12._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_12._M_str = in_stack_fffffffffffffcf0;
  alias_12._M_len = (size_t)pcVar5;
  addPublicationAlias(this_01,interfaceName_12,alias_12);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64dfbc);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64dfde);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_13._M_str = in_stack_fffffffffffffd00;
  interfaceName_13._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_13._M_str = in_stack_fffffffffffffcf0;
  alias_13._M_len = (size_t)pcVar5;
  addInputAlias(this_01,interfaceName_13,alias_13);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64e01e);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64e03d);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_14._M_str = in_stack_fffffffffffffd00;
  interfaceName_14._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_14._M_str = in_stack_fffffffffffffcf0;
  alias_14._M_len = (size_t)pcVar5;
  addEndpointAlias(this_01,interfaceName_14,alias_14);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64e07a);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  CLI::std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               *)0x64e099);
  std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffc50);
  interfaceName_15._M_str = in_stack_fffffffffffffd00;
  interfaceName_15._M_len = (size_t)in_stack_fffffffffffffcf8;
  alias_15._M_str = in_stack_fffffffffffffcf0;
  alias_15._M_len = (size_t)pcVar5;
  addFilterAlias(this_01,interfaceName_15,alias_15);
  return;
}

Assistant:

void HandleManager::addAlias(std::string_view interfaceName, std::string_view alias)
{
    // interfaceName needs to be stable to emplace here so we create a stable string in the aliases
    // map
    auto [aliasName, existing1] = alias_names.emplace(alias);
    auto [iName, existing2] = alias_names.emplace(interfaceName);
    const std::string& aliasStableName = *aliasName;
    const std::string& interfaceStableName = *iName;

    bool cascade = addAliasName(interfaceStableName, aliasStableName);

    if (cascade) {
        auto& aliasRange = aliases[interfaceStableName];
        for (auto& interfaceAlias : aliasRange) {
            if (interfaceAlias != alias) {
                addPublicationAlias(interfaceAlias, interfaceStableName);
                addInputAlias(interfaceAlias, interfaceStableName);
                addEndpointAlias(interfaceAlias, interfaceStableName);
                addFilterAlias(interfaceAlias, interfaceStableName);
            }
        }
    }

    // add aliases for existing interfaces
    addPublicationAlias(*iName, *aliasName);
    addInputAlias(*iName, *aliasName);
    addEndpointAlias(*iName, *aliasName);
    addFilterAlias(*iName, *aliasName);

    /** aliases should be reciprocal*/
    cascade = addAliasName(aliasStableName, interfaceStableName);

    if (cascade) {
        auto& aliasRange = aliases[aliasStableName];
        for (auto& interfaceAlias : aliasRange) {
            if (interfaceAlias != alias) {
                addPublicationAlias(interfaceAlias, aliasStableName);
                addInputAlias(interfaceAlias, aliasStableName);
                addEndpointAlias(interfaceAlias, aliasStableName);
                addFilterAlias(interfaceAlias, aliasStableName);
            }
        }
    }

    // add aliases for existing interfaces
    addPublicationAlias(*aliasName, *iName);
    addInputAlias(*aliasName, *iName);
    addEndpointAlias(*aliasName, *iName);
    addFilterAlias(*aliasName, *iName);
}